

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxp.c
# Opt level: O2

void duckdb_je_fxp_print(fxp_t a,char *buf)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  int i;
  int iVar4;
  int iVar5;
  long lVar6;
  
  uVar1 = (ulong)a & 0xffff;
  iVar5 = 0;
  for (iVar4 = 0; iVar4 != 0xe; iVar4 = iVar4 + 1) {
    if (uVar1 - 0x199a < 0xe666) {
      iVar5 = iVar4;
    }
    uVar1 = uVar1 * 10;
  }
  uVar1 = uVar1 >> 0x10;
  do {
    uVar2 = uVar1;
    if (uVar2 == 0) break;
    uVar1 = uVar2 / 10;
  } while (uVar2 % 10 == 0);
  lVar6 = 0;
  sVar3 = duckdb_je_malloc_snprintf(buf,0x15,"%u.",a >> 0x10);
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  for (; iVar5 != (int)lVar6; lVar6 = lVar6 + 1) {
    buf[lVar6 + sVar3] = '0';
  }
  duckdb_je_malloc_snprintf(buf + sVar3 + lVar6,0x15 - (sVar3 + lVar6),"%lu",uVar2);
  return;
}

Assistant:

void
fxp_print(fxp_t a, char buf[FXP_BUF_SIZE]) {
	uint32_t integer_part = fxp_round_down(a);
	uint32_t fractional_part = (a & ((1U << 16) - 1));

	int leading_fraction_zeros = 0;
	uint64_t fraction_digits = fractional_part;
	for (int i = 0; i < FXP_FRACTIONAL_PART_DIGITS; i++) {
		if (fraction_digits < (1U << 16)
		    && fraction_digits * 10 >= (1U << 16)) {
			leading_fraction_zeros = i;
		}
		fraction_digits *= 10;
	}
	fraction_digits >>= 16;
	while (fraction_digits > 0 && fraction_digits % 10 == 0) {
		fraction_digits /= 10;
	}

	size_t printed = malloc_snprintf(buf, FXP_BUF_SIZE, "%"FMTu32".",
	    integer_part);
	for (int i = 0; i < leading_fraction_zeros; i++) {
		buf[printed] = '0';
		printed++;
	}
	malloc_snprintf(&buf[printed], FXP_BUF_SIZE - printed, "%"FMTu64,
	    fraction_digits);
}